

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

int parser_skip_params(sf_parser *sfp)

{
  int iVar1;
  sf_vec *in_RDI;
  int rv;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  while( true ) {
    iVar1 = sf_parser_param((sf_parser *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                            (sf_value *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == -2) {
      return 0;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                    ,0x2b9,"int parser_skip_params(sf_parser *)");
    }
    in_stack_ffffffffffffffe8 = 0;
    in_stack_ffffffffffffffec = 0;
  }
  return -1;
}

Assistant:

static int parser_skip_params(sf_parser *sfp) {
  int rv;

  for (;;) {
    rv = sf_parser_param(sfp, NULL, NULL);
    switch (rv) {
    case 0:
      break;
    case SF_ERR_EOF:
      return 0;
    case SF_ERR_PARSE_ERROR:
      return rv;
    default:
      assert(0);
      abort();
    }
  }
}